

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O3

void __thiscall Context<false>::Context(Context<false> *this)

{
  (this->error_ptr)._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (this->namespace_path).super__Vector_base<Namespace<false>,_std::allocator<Namespace<false>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->namespace_path).super__Vector_base<Namespace<false>,_std::allocator<Namespace<false>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->namespace_path).super__Vector_base<Namespace<false>,_std::allocator<Namespace<false>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->default_state).super_BaseState<false>.name = "Default";
  (this->default_state).super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002cfc60;
  (this->label_state).super_BaseState<false>.name = "Label";
  (this->label_state).super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002cfce8;
  (this->label_object_state).super_BaseState<false>.name = "LabelObject";
  (this->label_object_state).super_BaseState<false>._vptr_BaseState =
       (_func_int **)&PTR_Null_002cfd60;
  (this->label_single_property_state).super_BaseState<false>.name = "LabelSingleProperty";
  (this->label_single_property_state).super_BaseState<false>._vptr_BaseState =
       (_func_int **)&PTR_Null_002cfdd8;
  (this->label_index_state).super_BaseState<false>.name = "LabelIndex";
  (this->label_index_state).super_BaseState<false>._vptr_BaseState =
       (_func_int **)&PTR_Null_002cfe50;
  (this->label_index_state).index = -1;
  (this->text_state).super_BaseState<false>.name = "text";
  (this->text_state).super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002cfec8;
  (this->tag_state).super_BaseState<false>.name = "tag";
  (this->tag_state).super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002cff40;
  (this->multi_state).super_BaseState<false>.name = "Multi";
  (this->multi_state).super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002cffb8;
  (this->ignore_state).super_BaseState<false>.name = "Ignore";
  (this->ignore_state).super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002d0030;
  (this->array_state).super_BaseState<false>.name = "Array";
  (this->array_state).super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002d00a8;
  (this->decision_service_state).super_BaseState<false>.name = "DecisionService";
  (this->decision_service_state).super_BaseState<false>._vptr_BaseState =
       (_func_int **)&PTR_Null_002d0120;
  (this->array_float_state).super_BaseState<false>.name = "ArrayToVectorState";
  (this->array_float_state).super_BaseState<false>._vptr_BaseState =
       (_func_int **)&PTR_Null_002d0198;
  (this->array_uint_state).super_BaseState<false>.name = "ArrayToVectorState";
  (this->array_uint_state).super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002d0210
  ;
  (this->string_state).super_BaseState<false>.name = "StringToStringState";
  (this->string_state).super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002d0288;
  (this->float_state).super_BaseState<false>.name = "FloatToFloatState";
  (this->float_state).super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002d0300;
  (this->bool_state).super_BaseState<false>.name = "BoolToBoolState";
  (this->bool_state).super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002d0378;
  this->current_state = &(this->default_state).super_BaseState<false>;
  this->root_state = &(this->default_state).super_BaseState<false>;
  return;
}

Assistant:

Context()
  {
    current_state = &default_state;
    root_state = &default_state;
  }